

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall
program_options::too_many_positional_options_error::too_many_positional_options_error
          (too_many_positional_options_error *this)

{
  error *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  error::error(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  *(undefined ***)in_RDI = &PTR__too_many_positional_options_error_00152a10;
  return;
}

Assistant:

too_many_positional_options_error()
     : error("too many positional options have been specified on the command line")
    {}